

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateFillStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  FillStaticLayerParams *pFVar2;
  string err;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,0,0);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar1 = Result::good(&r);
  if (bVar1) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  pFVar2 = Specification::NeuralNetworkLayer::fillstatic(layer);
  if ((pFVar2->targetshape_).current_size_ == 0) {
    std::operator+(&local_38,"Target shape is required parameter for \'",(layer->name_).ptr_);
    std::operator+(&err,&local_38,"\' layer.");
    std::__cxx11::string::~string((string *)&local_38);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    std::__cxx11::string::~string((string *)&err);
  }
  else {
    Result::Result(__return_storage_ptr__,&r);
  }
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateFillStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 0);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.fillstatic();
    if (params.targetshape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}